

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O1

antecedentConsequentVectorsStruct * allocAntecedentConsequentVectorsStruct(void)

{
  antecedentConsequentVectorsStruct *paVar1;
  
  paVar1 = (antecedentConsequentVectorsStruct *)malloc(0x10);
  paVar1->attrAntecedents = (Vec_Int_t *)0x0;
  paVar1->attrConsequentCandidates = (Vec_Int_t *)0x0;
  return paVar1;
}

Assistant:

struct antecedentConsequentVectorsStruct *allocAntecedentConsequentVectorsStruct()
{
	struct antecedentConsequentVectorsStruct *newStructure;

	newStructure = (struct antecedentConsequentVectorsStruct *)malloc(sizeof (struct antecedentConsequentVectorsStruct));

	newStructure->attrAntecedents = NULL;
	newStructure->attrConsequentCandidates = NULL;
		
	assert( newStructure != NULL );
	return newStructure;
}